

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O2

void aom_highbd_blend_a64_d16_mask_c
               (uint8_t *dst_8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  int j_1;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int j;
  uint uVar10;
  ulong uVar11;
  
  cVar2 = (char)conv_params->round_1 + (char)conv_params->round_0;
  cVar1 = (char)bd - cVar2;
  iVar5 = (-1 << (cVar1 + 0xdU & 0x1f)) + (-1 << (cVar1 + 0xeU & 0x1f));
  bVar3 = 0xe - cVar2;
  lVar6 = (long)dst_8 * 2;
  iVar9 = 0xff;
  if (bd == 10) {
    iVar9 = 0x3ff;
  }
  iVar7 = 0xfff;
  if (bd != 0xc) {
    iVar7 = iVar9;
  }
  if (subh == 0 && subw == 0) {
    uVar10 = 0;
    if (w < 1) {
      w = uVar10;
    }
    if (h < 1) {
      h = uVar10;
    }
    for (; uVar10 != h; uVar10 = uVar10 + 1) {
      for (uVar4 = 0; (uint)w != uVar4; uVar4 = uVar4 + 1) {
        iVar9 = ((int)((uint)src1[uVar4] * (0x40 - (uint)mask[uVar4]) +
                      (uint)src0[uVar4] * (uint)mask[uVar4]) >> 6) +
                iVar5 + ((1 << (bVar3 & 0x1f)) >> 1);
        if (iVar9 >> (bVar3 & 0x1f) < 1) {
          iVar9 = 0;
        }
        iVar9 = iVar9 >> (bVar3 & 0x1f);
        if (iVar7 <= iVar9) {
          iVar9 = iVar7;
        }
        *(short *)(lVar6 + uVar4 * 2) = (short)iVar9;
      }
      mask = mask + mask_stride;
      lVar6 = lVar6 + (ulong)dst_stride * 2;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    uVar10 = 0;
    if (w < 1) {
      w = uVar10;
    }
    if (h < 1) {
      h = uVar10;
    }
    for (; uVar4 = (ulong)mask_stride, uVar10 != h; uVar10 = uVar10 + 1) {
      for (uVar11 = 0; (uint)w != uVar11; uVar11 = uVar11 + 1) {
        uVar8 = (uint)mask[(int)uVar4 + 1] +
                (uint)mask[uVar11 * 2 + 1] + (uint)mask[uVar11 * 2] + (uint)mask[uVar4] + 2 >> 2;
        iVar9 = ((int)((uint)src1[uVar11] * (0x40 - uVar8) + src0[uVar11] * uVar8) >> 6) +
                iVar5 + ((1 << (bVar3 & 0x1f)) >> 1);
        if (iVar9 >> (bVar3 & 0x1f) < 1) {
          iVar9 = 0;
        }
        iVar9 = iVar9 >> (bVar3 & 0x1f);
        if (iVar7 <= iVar9) {
          iVar9 = iVar7;
        }
        *(short *)(lVar6 + uVar11 * 2) = (short)iVar9;
        uVar4 = (ulong)((int)uVar4 + 2);
      }
      mask = mask + mask_stride * 2;
      lVar6 = lVar6 + (ulong)dst_stride * 2;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    }
  }
  else {
    iVar5 = iVar5 + ((1 << (bVar3 & 0x1f)) >> 1);
    if ((subw ^ 1U) == 0 && subh == 0) {
      uVar10 = 0;
      if (w < 1) {
        w = uVar10;
      }
      if (h < 1) {
        h = uVar10;
      }
      for (; uVar10 != h; uVar10 = uVar10 + 1) {
        for (uVar4 = 0; (uint)w != uVar4; uVar4 = uVar4 + 1) {
          uVar8 = (uint)mask[uVar4 * 2] + (uint)mask[uVar4 * 2 + 1] + 1 >> 1 & 0xff;
          iVar9 = ((int)((uint)src1[uVar4] * (0x40 - uVar8) + src0[uVar4] * uVar8) >> 6) + iVar5;
          if (iVar9 >> (bVar3 & 0x1f) < 1) {
            iVar9 = 0;
          }
          iVar9 = iVar9 >> (bVar3 & 0x1f);
          if (iVar7 <= iVar9) {
            iVar9 = iVar7;
          }
          *(short *)(lVar6 + uVar4 * 2) = (short)iVar9;
        }
        mask = mask + mask_stride;
        lVar6 = lVar6 + (ulong)dst_stride * 2;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
      }
    }
    else {
      uVar10 = 0;
      if (w < 1) {
        w = uVar10;
      }
      if (h < 1) {
        h = uVar10;
      }
      for (; uVar10 != h; uVar10 = uVar10 + 1) {
        for (uVar4 = 0; (uint)w != uVar4; uVar4 = uVar4 + 1) {
          uVar8 = (uint)mask[uVar4] + (uint)mask[mask_stride + (int)uVar4] + 1 >> 1 & 0xff;
          iVar9 = ((int)((uint)src1[uVar4] * (0x40 - uVar8) + src0[uVar4] * uVar8) >> 6) + iVar5;
          if (iVar9 >> (bVar3 & 0x1f) < 1) {
            iVar9 = 0;
          }
          iVar9 = iVar9 >> (bVar3 & 0x1f);
          if (iVar7 <= iVar9) {
            iVar9 = iVar7;
          }
          *(short *)(lVar6 + uVar4 * 2) = (short)iVar9;
        }
        mask = mask + mask_stride * 2;
        lVar6 = lVar6 + (ulong)dst_stride * 2;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
      }
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_c(
    uint8_t *dst_8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  // excerpt from clip_pixel_highbd()
  // set saturation_value to (1 << bd) - 1
  unsigned int saturation_value;
  switch (bd) {
    case 8:
    default: saturation_value = 255; break;
    case 10: saturation_value = 1023; break;
    case 12: saturation_value = 4095; break;
  }

  if (subw == 0 && subh == 0) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = mask[j];
        res = ((m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else if (subw == 1 && subh == 1) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = ROUND_POWER_OF_TWO(
            mask[2 * j] + mask[mask_stride + 2 * j] + mask[2 * j + 1] +
                mask[mask_stride + 2 * j + 1],
            2);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += 2 * mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else if (subw == 1 && subh == 0) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[2 * j], mask[2 * j + 1]);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[j], mask[mask_stride + j]);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += 2 * mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  }
}